

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O1

void Fxu_HeapDoubleInsert(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  int iVar1;
  Fxu_Double **ppFVar2;
  int iVar3;
  ulong __size;
  
  iVar1 = p->nItemsAlloc;
  if (p->nItems == iVar1) {
    p->nItemsAlloc = iVar1 * 2;
    __size = (long)iVar1 << 4 | 8;
    if (p->pTree == (Fxu_Double **)0x0) {
      ppFVar2 = (Fxu_Double **)malloc(__size);
    }
    else {
      ppFVar2 = (Fxu_Double **)realloc(p->pTree,__size);
    }
    p->pTree = ppFVar2;
  }
  iVar1 = p->nItems;
  iVar3 = iVar1 + 1;
  p->nItems = iVar3;
  p->pTree[(long)iVar1 + 1] = pDiv;
  pDiv->HNum = iVar3;
  Fxu_HeapDoubleMoveUp(p,pDiv);
  return;
}

Assistant:

void Fxu_HeapDoubleInsert( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
    if ( p->nItems == p->nItemsAlloc )
        Fxu_HeapDoubleResize( p );
    // put the last entry to the last place and move up
    p->pTree[++p->nItems] = pDiv;
    pDiv->HNum = p->nItems;
    // move the last entry up if necessary
    Fxu_HeapDoubleMoveUp( p, pDiv );
}